

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_newproxy(lua_State *L)

{
  uint uVar1;
  int iVar2;
  TValue *pTVar3;
  ulong uVar4;
  uint *puVar5;
  cTValue *pcVar6;
  
  lua_settop(L,1);
  lua_newuserdata(L,0);
  pTVar3 = L->base;
  if (L->top <= pTVar3) {
    pTVar3 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
  }
  if ((pTVar3->field_2).it < 0xfffffffe) {
    iVar2 = lua_type(L,1);
    if (iVar2 == 1) {
      lua_createtable(L,0,0);
      lua_pushvalue(L,-1);
      (L->top->field_2).it = 0xfffffffd;
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar3 + 1) {
        lj_state_growstack(L,1);
      }
      lua_rawset(L,-0x2713);
    }
    else {
      iVar2 = lua_getmetatable(L,1);
      if (iVar2 == 0) {
LAB_001439a5:
        lj_err_arg(L,1,LJ_ERR_NOPROXY);
      }
      uVar4 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar4 + 7) == '\0') {
        puVar5 = (uint *)((ulong)(L->glref).ptr32 + 0x68);
      }
      else {
        puVar5 = (uint *)(uVar4 + 0x20);
      }
      pTVar3 = L->top;
      pcVar6 = lj_tab_get(L,(GCtab *)(ulong)*puVar5,pTVar3 + -1);
      pTVar3[-1] = *pcVar6;
      uVar1 = *(uint *)((long)L->top + -4);
      L->top = L->top + -1;
      if (0xfffffffd < uVar1) goto LAB_001439a5;
      lua_getmetatable(L,1);
    }
    lua_setmetatable(L,2);
  }
  return 1;
}

Assistant:

LJLIB_CF(newproxy)
{
  lua_settop(L, 1);
  lua_newuserdata(L, 0);
  if (lua_toboolean(L, 1) == 0) {  /* newproxy(): without metatable. */
    return 1;
  } else if (lua_isboolean(L, 1)) {  /* newproxy(true): with metatable. */
    lua_newtable(L);
    lua_pushvalue(L, -1);
    lua_pushboolean(L, 1);
    lua_rawset(L, lua_upvalueindex(1));  /* Remember mt in weak table. */
  } else {  /* newproxy(proxy): inherit metatable. */
    int validproxy = 0;
    if (lua_getmetatable(L, 1)) {
      lua_rawget(L, lua_upvalueindex(1));
      validproxy = lua_toboolean(L, -1);
      lua_pop(L, 1);
    }
    if (!validproxy)
      lj_err_arg(L, 1, LJ_ERR_NOPROXY);
    lua_getmetatable(L, 1);
  }
  lua_setmetatable(L, 2);
  return 1;
}